

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txout_txoutreference.cpp
# Opt level: O2

void __thiscall
TxOutReference_GetSerializeSize_Test::TestBody(TxOutReference_GetSerializeSize_Test *this)

{
  char *message;
  Amount AVar1;
  AssertHelper local_c8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  AssertionResult gtest_ar;
  TxOutReference txout_ref;
  TxOut txout;
  
  AVar1 = cfd::core::Amount::CreateBySatoshiAmount(1000000);
  txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)AVar1.amount_;
  txout_ref.super_AbstractTxOutReference.value_.amount_._0_1_ = AVar1.ignore_check_;
  cfd::core::TxOut::TxOut(&txout,(Amount *)&txout_ref,&exp_script);
  cfd::core::TxOutReference::TxOutReference(&txout_ref,&txout);
  local_c0.ptr_._0_4_ =
       cfd::core::AbstractTxOutReference::GetSerializeSize(&txout_ref.super_AbstractTxOutReference);
  local_c8.data_._0_4_ = 0x22;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txout_ref.GetSerializeSize()","34",(uint *)&local_c0,
             (int *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxOutReference::~AbstractTxOutReference
            (&txout_ref.super_AbstractTxOutReference);
  cfd::core::AbstractTxOut::~AbstractTxOut(&txout.super_AbstractTxOut);
  return;
}

Assistant:

TEST(TxOutReference, GetSerializeSize) {
  {
    int64_t satoshi = 1000000;
    TxOut txout(Amount::CreateBySatoshiAmount(satoshi), exp_script);
    TxOutReference txout_ref(txout);

    EXPECT_EQ(txout_ref.GetSerializeSize(), 34);
  }
}